

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.h
# Opt level: O2

optional<unsigned_short> ToIntegral<unsigned_short>(string_view str)

{
  _Optional_payload_base<unsigned_short> _Var1;
  char *__last;
  _Optional_payload_base<unsigned_short> _Var2;
  long in_FS_OFFSET;
  __integer_from_chars_result_type<unsigned_short> _Var3;
  unsigned_short result;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  __last = str._M_str + str._M_len;
  _Var3 = std::from_chars<unsigned_short>(str._M_str,__last,&result,10);
  _Var2._M_payload = (_Storage<unsigned_short,_true>)0x0;
  _Var2._M_engaged = false;
  _Var2._3_1_ = 0;
  _Var1 = (_Optional_payload_base<unsigned_short>)(result | 0x10000);
  if (_Var3.ec != 0) {
    _Var1 = _Var2;
  }
  if (_Var3.ptr != __last) {
    _Var1._M_payload = (_Storage<unsigned_short,_true>)0x0;
    _Var1._M_engaged = false;
    _Var1._3_1_ = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (_Optional_base<unsigned_short,_true,_true>)
           (_Optional_base<unsigned_short,_true,_true>)_Var1;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<T> ToIntegral(std::string_view str)
{
    static_assert(std::is_integral<T>::value);
    T result;
    const auto [first_nonmatching, error_condition] = std::from_chars(str.data(), str.data() + str.size(), result);
    if (first_nonmatching != str.data() + str.size() || error_condition != std::errc{}) {
        return std::nullopt;
    }
    return result;
}